

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImVector<ImGuiOldColumnData> *this;
  float fVar1;
  bool bVar2;
  ImGuiOldColumns *pIVar3;
  ImGuiContext_conflict1 *pIVar4;
  ImGuiOldColumnData *pIVar5;
  int i;
  uint uVar6;
  float fVar7;
  float fVar8;
  float local_50;
  
  while( true ) {
    pIVar4 = GImGui;
    pIVar3 = (GImGui->CurrentWindow->DC).CurrentColumns;
    if (pIVar3 == (ImGuiOldColumns *)0x0) {
      __assert_fail("columns != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0xe94,"void ImGui::SetColumnOffset(int, float)");
    }
    if (column_index < 0) {
      column_index = pIVar3->Current;
    }
    if ((pIVar3->Columns).Size <= column_index) break;
    this = &pIVar3->Columns;
    uVar6 = pIVar3->Flags;
    fVar7 = 0.0;
    if (((uVar6 & 4) == 0) && (column_index < pIVar3->Count + -1)) {
      i = column_index;
      if (column_index < 0) {
        i = pIVar3->Current;
      }
      bVar2 = pIVar3->IsBeingResized;
      pIVar5 = ImVector<ImGuiOldColumnData>::operator[](this,i + 1);
      if (bVar2 == false) {
        local_50 = pIVar5->OffsetNorm;
        pIVar5 = ImVector<ImGuiOldColumnData>::operator[](this,i);
      }
      else {
        local_50 = pIVar5->OffsetNormBeforeResize;
        pIVar5 = ImVector<ImGuiOldColumnData>::operator[](this,i);
        pIVar5 = (ImGuiOldColumnData *)&pIVar5->OffsetNormBeforeResize;
      }
      fVar7 = (pIVar3->OffMaxX - pIVar3->OffMinX) * (local_50 - pIVar5->OffsetNorm);
      uVar6 = pIVar3->Flags;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    fVar1 = pIVar3->OffMaxX;
    if (((uVar6 & 8) == 0) &&
       (fVar8 = fVar1 - (float)(pIVar3->Count - column_index) * (pIVar4->Style).ColumnsMinSpacing,
       fVar8 <= offset)) {
      offset = fVar8;
    }
    fVar8 = pIVar3->OffMinX;
    pIVar5 = ImVector<ImGuiOldColumnData>::operator[](this,column_index);
    pIVar5->OffsetNorm = (offset - fVar8) / (fVar1 - fVar8);
    if (!bVar2) {
      return;
    }
    column_index = column_index + 1;
    fVar1 = (pIVar4->Style).ColumnsMinSpacing;
    uVar6 = -(uint)(fVar7 <= fVar1);
    offset = offset + (float)(~uVar6 & (uint)fVar7 | (uint)fVar1 & uVar6);
  }
  __assert_fail("column_index < columns->Columns.Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                ,0xe98,"void ImGui::SetColumnOffset(int, float)");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const bool preserve_width = !(columns->Flags & ImGuiOldColumnFlags_NoPreserveWidths) && (column_index < columns->Count - 1);
    const float width = preserve_width ? GetColumnWidthEx(columns, column_index, columns->IsBeingResized) : 0.0f;

    if (!(columns->Flags & ImGuiOldColumnFlags_NoForceWithinWindow))
        offset = ImMin(offset, columns->OffMaxX - g.Style.ColumnsMinSpacing * (columns->Count - column_index));
    columns->Columns[column_index].OffsetNorm = GetColumnNormFromOffset(columns, offset - columns->OffMinX);

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}